

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O0

char * mi_heap_strndup(mi_heap_t *heap,char *s,size_t n)

{
  size_t sVar1;
  size_t in_RDX;
  char *in_RSI;
  char *t;
  size_t len;
  void *in_stack_ffffffffffffffc8;
  mi_heap_t *in_stack_ffffffffffffffd0;
  char *local_8;
  
  if (in_RSI == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    sVar1 = _mi_strnlen(in_RSI,in_RDX);
    local_8 = (char *)mi_heap_malloc(in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8);
    if (local_8 == (char *)0x0) {
      local_8 = (char *)0x0;
    }
    else {
      _mi_memcpy(local_8,in_stack_ffffffffffffffc8,0xa82229);
      local_8[sVar1] = '\0';
    }
  }
  return local_8;
}

Assistant:

char* mi_heap_strndup(mi_heap_t* heap, const char* s, size_t n) mi_attr_noexcept {
  if (s == NULL) return NULL;
  const size_t len = _mi_strnlen(s,n);  // len <= n
  char* t = (char*)mi_heap_malloc(heap, len+1);
  if (t == NULL) return NULL;
  _mi_memcpy(t, s, len);
  t[len] = 0;
  return t;
}